

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.hpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_PatchVerticesIn::_test_descriptor::_test_descriptor
          (_test_descriptor *this)

{
  _test_descriptor *this_local;
  
  this->fs_id = 0;
  this->po_id = 0;
  this->tcs_id = 0;
  this->tes_id = 0;
  this->vs_id = 0;
  this->input_patch_size = 0;
  this->type = TESSELLATION_TEST_TYPE_COUNT;
  return;
}

Assistant:

_test_descriptor()
		{
			fs_id  = 0;
			po_id  = 0;
			tcs_id = 0;
			tes_id = 0;
			vs_id  = 0;

			input_patch_size = 0;
			type			 = TESSELLATION_TEST_TYPE_COUNT;
		}